

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O3

void __thiscall
Diligent::DearchiverBase::NamedResourceCache<Diligent::IPipelineResourceSignature>::Set
          (NamedResourceCache<Diligent::IPipelineResourceSignature> *this,ResourceType Type,
          char *Name,IPipelineResourceSignature *pResource)

{
  IPipelineResourceSignature *Args_1;
  string msg;
  unique_lock<std::mutex> Lock;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  IPipelineResourceSignature *local_40;
  unique_lock<std::mutex> local_38;
  
  local_40 = pResource;
  if ((Name == (char *)0x0) || (Args_1 = pResource, *Name == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",(char (*) [35])pResource);
    Args_1 = (IPipelineResourceSignature *)0xac;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_60._4_4_,local_60._0_4_),"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xac);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_60._4_4_,local_60._0_4_),local_50._M_allocated_capacity + 1)
      ;
    }
  }
  if (pResource == (IPipelineResourceSignature *)0x0) {
    FormatString<char[26],char[21]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pResource != nullptr",(char (*) [21])Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_60._4_4_,local_60._0_4_),"Set",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0xad);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_60._4_4_,local_60._0_4_),local_50._M_allocated_capacity + 1)
      ;
    }
  }
  local_38._M_owns = false;
  local_38._M_device = &this->m_Mtx;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  local_60._0_4_ = Type;
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)(local_60 + 8),Name,true);
  std::
  _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<Diligent::DeviceObjectArchive::NamedResourceKey,Diligent::IPipelineResourceSignature*&>
            ((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>,std::allocator<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::RefCntWeakPtr<Diligent::IPipelineResourceSignature>>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->m_Map,local_60,&local_40);
  if (((void *)local_60._8_8_ != (void *)0x0) && ((long)local_50._M_allocated_capacity < 0)) {
    operator_delete__((void *)local_60._8_8_);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void DearchiverBase::NamedResourceCache<ResType>::Set(ResourceType Type, const char* Name, ResType* pResource)
{
    VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
    VERIFY_EXPR(pResource != nullptr);

    std::unique_lock<std::mutex> Lock{m_Mtx};
    m_Map.emplace(NamedResourceKey{Type, Name, /*CopyName = */ true}, pResource);
}